

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O0

void aq_insert_dummy_adus(aq_t *q)

{
  void *pvVar1;
  void *pvVar2;
  dlist_t *pdVar3;
  int local_34;
  int back_ptr;
  adu_t *prev;
  uint prev_adu_end;
  adu_t *tail;
  dlist_t *dlist;
  aq_t *q_local;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x1dc,"void aq_insert_dummy_adus(aq_t *)");
  }
  pdVar3 = aq_tail_adu(q);
  if (pdVar3 != (dlist_t *)0x0) {
    pvVar1 = pdVar3->data;
    if (pvVar1 == (void *)0x0) {
      __assert_fail("tail != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e1,
                    "void aq_insert_dummy_adus(aq_t *)");
    }
    prev._4_4_ = 0;
    if (pdVar3->prev != (dlist_s *)0x0) {
      pvVar2 = pdVar3->prev->data;
      if (pvVar2 == (void *)0x0) {
        __assert_fail("prev != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e6,
                      "void aq_insert_dummy_adus(aq_t *)");
      }
      prev._4_4_ = ((int)*(undefined8 *)((long)pvVar2 + 0x4eb0) + *(int *)((long)pvVar2 + 0x10)) -
                   (int)*(undefined8 *)((long)pvVar2 + 0x4e80);
    }
    for (local_34 = *(int *)((long)pvVar1 + 0x10) - prev._4_4_; 0 < local_34;
        local_34 = local_34 - (int)*(undefined8 *)((long)pvVar1 + 0x4eb0)) {
      aq_insert_dummy_adu(q,prev._4_4_);
      prev._4_4_ = 0;
    }
    return;
  }
  __assert_fail("dlist != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                ,0x1df,"void aq_insert_dummy_adus(aq_t *)");
}

Assistant:

static void aq_insert_dummy_adus(aq_t *q) {
  assert(q != NULL);

  dlist_t *dlist = aq_tail_adu(q);
  assert(dlist != NULL);
  adu_t *tail = dlist->data;
  assert(tail != NULL);

  unsigned int prev_adu_end = 0;
  if (dlist->prev) {
    adu_t *prev = dlist->prev->data;
    assert(prev != NULL);

    prev_adu_end =
      prev->frame_data_size + prev->si.main_data_end - prev->adu_size;
    assert((prev_adu_end >= 0) || "bad formed ADU frame");
  }

  /* insert the necessary dummy adus */
  int back_ptr = tail->si.main_data_end - prev_adu_end;
  for (; back_ptr > 0;
         back_ptr -= tail->frame_data_size,
         prev_adu_end = 0)
    aq_insert_dummy_adu(q, prev_adu_end);
}